

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O1

void __thiscall polyscope::RibbonArtist::createProgram(RibbonArtist *this)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  byte bVar11;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar12;
  Engine *pEVar13;
  pointer pvVar14;
  vec<3,_float,_(glm::qualifier)0> *pvVar15;
  ulong uVar16;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar17;
  long lVar18;
  long in_R9;
  long in_R10;
  long in_R11;
  ulong uVar19;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL> *pn;
  vec<3,_float,_(glm::qualifier)0> *__args;
  ushort uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar31 [64];
  double dVar32;
  undefined1 auVar33 [56];
  undefined1 auVar38 [12];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vec3 vVar41;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  uint restartInd;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  positions;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  line;
  vec<3,_float,_(glm::qualifier)0> local_1b8;
  undefined1 local_1a8 [16];
  vec<3,_float,_(glm::qualifier)0> *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  void *local_168;
  iterator iStack_160;
  uint *local_158;
  uint local_14c;
  vec<3,_float,_(glm::qualifier)0> **local_148;
  iterator iStack_140;
  vec<3,_float,_(glm::qualifier)0> *local_138 [2];
  undefined8 local_128;
  float local_120;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  local_118;
  uint local_fc;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  RibbonArtist *local_e8;
  ValueColorMap *local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [64];
  ulong uVar21;
  undefined1 auVar30 [64];
  
  pEVar13 = render::engine;
  auVar38 = in_ZMM2._4_12_;
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"RIBBON","");
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar18 = 0;
  (*pEVar13->_vptr_Engine[0x23])(local_1a8,pEVar13,&local_148);
  this_00 = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_1a8._0_8_;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
  local_1a8 = ZEXT816(0) << 0x40;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_14c = 0xffffffff;
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar6->_vptr_ShaderProgram[0x1d])(peVar6,0xffffffff);
  local_78._0_8_ = state::lengthScale * this->normalOffsetFraction;
  local_138[0] = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_148 = (vec<3,_float,_(glm::qualifier)0> **)0x0;
  iStack_140._M_current = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198 = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_1a8 = ZEXT816(0);
  local_158 = (uint *)0x0;
  local_168 = (void *)0x0;
  iStack_160._M_current = (uint *)0x0;
  local_e0 = render::Engine::getColorMap(render::engine,&this->cMap);
  pvVar14 = (this->ribbons).
            super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ribbons).
      super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar14) {
    auVar22._0_4_ = (float)(double)local_78._0_8_;
    auVar22._4_12_ = auVar38;
    local_78 = vbroadcastss_avx512f(auVar22);
    aVar17.x = 0.0;
    uVar19 = 0;
    local_e8 = this;
    do {
      std::
      vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
      ::vector(&local_118,pvVar14 + uVar19);
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_118.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        auVar25 = vpbroadcastq_avx512f();
        auVar25 = vpsrlq_avx512f(auVar25,4);
        uVar16 = 0;
        pvVar15 = (local_118.
                   super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar26,auVar23);
          auVar26 = vporq_avx512f(auVar26,auVar24);
          uVar7 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar10 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar27,auVar25,2);
          bVar11 = (byte)uVar7;
          uVar20 = CONCAT11(bVar11,bVar10);
          uVar21 = (ulong)uVar20;
          auVar27 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar15[1].field_0 + lVar18));
          auVar26._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar27._4_4_;
          auVar26._0_4_ = (uint)(bVar10 & 1) * auVar27._0_4_;
          auVar26._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar27._8_4_;
          auVar26._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar27._12_4_;
          auVar26._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar27._16_4_;
          auVar26._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar27._20_4_;
          auVar26._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar27._24_4_;
          auVar26._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar27._28_4_;
          auVar26._32_4_ = (uint)(bVar11 & 1) * auVar27._32_4_;
          auVar26._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar27._36_4_;
          auVar26._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar27._40_4_;
          auVar26._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar27._44_4_;
          auVar26._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar27._48_4_;
          auVar26._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar27._52_4_;
          auVar26._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar27._56_4_;
          auVar26._60_4_ = (uint)(bVar11 >> 7) * auVar27._60_4_;
          auVar26 = vmulps_avx512f(auVar26,local_78);
          auVar27 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar15->field_0 + in_R9));
          auVar28._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar27._4_4_;
          auVar28._0_4_ = (uint)(bVar10 & 1) * auVar27._0_4_;
          auVar28._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar27._8_4_;
          auVar28._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar27._12_4_;
          auVar28._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar27._16_4_;
          auVar28._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar27._20_4_;
          auVar28._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar27._24_4_;
          auVar28._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar27._28_4_;
          auVar28._32_4_ = (uint)(bVar11 & 1) * auVar27._32_4_;
          auVar28._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar27._36_4_;
          auVar28._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar27._40_4_;
          auVar28._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar27._44_4_;
          auVar28._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar27._48_4_;
          auVar28._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar27._52_4_;
          auVar28._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar27._56_4_;
          auVar28._60_4_ = (uint)(bVar11 >> 7) * auVar27._60_4_;
          auVar27 = vmulps_avx512f(auVar28,local_78);
          auVar28 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar15->field_0 + in_R10));
          auVar29._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar28._4_4_;
          auVar29._0_4_ = (uint)(bVar10 & 1) * auVar28._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar28._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar28._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar28._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar28._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar28._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar28._28_4_;
          auVar29._32_4_ = (uint)(bVar11 & 1) * auVar28._32_4_;
          auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar28._36_4_;
          auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar28._40_4_;
          auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar28._44_4_;
          auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar28._48_4_;
          auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar28._52_4_;
          auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar28._56_4_;
          auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar28._60_4_;
          auVar28 = vmulps_avx512f(auVar29,local_78);
          auVar29 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar15->field_0 + lVar18));
          auVar30._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar29._4_4_;
          auVar30._0_4_ = (uint)(bVar10 & 1) * auVar29._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar29._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar29._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar29._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar29._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar29._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar29._28_4_;
          auVar30._32_4_ = (uint)(bVar11 & 1) * auVar29._32_4_;
          auVar30._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar29._36_4_;
          auVar30._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar29._40_4_;
          auVar30._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar29._44_4_;
          auVar30._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar29._48_4_;
          auVar30._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar29._52_4_;
          auVar30._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar29._56_4_;
          auVar30._60_4_ = (uint)(bVar11 >> 7) * auVar29._60_4_;
          auVar26 = vaddps_avx512f(auVar26,auVar30);
          vscatterdps_avx512f(ZEXT864(pvVar15) + _DAT_002af300,uVar21,auVar26);
          auVar26 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar15->field_0 + in_R11));
          auVar31._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar26._4_4_;
          auVar31._0_4_ = (uint)(bVar10 & 1) * auVar26._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar26._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar26._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar26._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar26._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar26._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar26._28_4_;
          auVar31._32_4_ = (uint)(bVar11 & 1) * auVar26._32_4_;
          auVar31._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar26._36_4_;
          auVar31._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar26._40_4_;
          auVar31._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar26._44_4_;
          auVar31._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar26._48_4_;
          auVar31._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar26._52_4_;
          auVar31._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar26._56_4_;
          auVar31._60_4_ = (uint)(bVar11 >> 7) * auVar26._60_4_;
          auVar26 = vaddps_avx512f(auVar27,auVar31);
          vscatterdps_avx512f(ZEXT864(pvVar15) + _DAT_002af3c0,uVar21,auVar26);
          auVar26 = vgatherdps_avx512f(*(undefined4 *)((long)&pvVar15->field_0 + uVar19));
          auVar27._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar26._4_4_;
          auVar27._0_4_ = (uint)(bVar10 & 1) * auVar26._0_4_;
          auVar27._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar26._8_4_;
          auVar27._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar26._12_4_;
          auVar27._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar26._16_4_;
          auVar27._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar26._20_4_;
          auVar27._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar26._24_4_;
          auVar27._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar26._28_4_;
          auVar27._32_4_ = (uint)(bVar11 & 1) * auVar26._32_4_;
          auVar27._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar26._36_4_;
          auVar27._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar26._40_4_;
          auVar27._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar26._44_4_;
          auVar27._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar26._48_4_;
          auVar27._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar26._52_4_;
          auVar27._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar26._56_4_;
          auVar27._60_4_ = (uint)(bVar11 >> 7) * auVar26._60_4_;
          auVar26 = vaddps_avx512f(auVar28,auVar27);
          vscatterdps_avx512f(ZEXT864(pvVar15) + _DAT_002af400,uVar21,auVar26);
          uVar16 = uVar16 + 0x10;
          pvVar15 = pvVar15 + 0x20;
        } while (((ulong)((long)local_118.
                                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish +
                         (-0x18 - (long)local_118.
                                        super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)) / 0x18 + 0x10 &
                 0xfffffffffffffff0) != uVar16);
      }
      if (1 < (ulong)(((long)local_118.
                             super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_118.
                             super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
      {
        dVar32 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)&util_mersenne_twister);
        auVar33 = (undefined1  [56])0x0;
        vVar41 = render::ValueColorMap::getValue(local_e0,dVar32 + 0.0);
        local_1b8.field_2 = vVar41.field_2;
        auVar23._0_8_ = vVar41._0_8_;
        auVar23._8_56_ = auVar33;
        local_1b8._0_8_ = vmovlpd_avx(auVar23._0_16_);
        uVar16 = *(ulong *)local_118.
                           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar16;
        uVar2 = local_118.
                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[0].field_0;
        uVar4 = local_118.
                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_elems[0].field_1;
        auVar39._4_4_ = uVar4;
        auVar39._0_4_ = uVar2;
        auVar39._8_8_ = 0;
        auVar22 = vsubps_avx(auVar34,auVar39);
        auVar8._8_4_ = 0x3c23d70a;
        auVar8._0_8_ = 0x3c23d70a3c23d70a;
        auVar8._12_4_ = 0x3c23d70a;
        auVar22 = vmulps_avx512vl(auVar22,auVar8);
        auVar35._0_4_ = (float)uVar16 + auVar22._0_4_;
        auVar35._4_4_ = (float)(uVar16 >> 0x20) + auVar22._4_4_;
        auVar35._8_4_ = auVar22._8_4_ + 0.0;
        auVar35._12_4_ = auVar22._12_4_ + 0.0;
        local_f8.field_2.z =
             ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             ((long)local_118.
                    super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 8))->z +
             (((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
              ((long)local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8))->z -
             (((vec<3,_float,_(glm::qualifier)0> *)
              ((long)local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x18))->field_2).z) * 0.01;
        local_f8._0_8_ = vmovlps_avx(auVar35);
        if (iStack_140._M_current == local_138[0]) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_148,iStack_140,&local_f8);
        }
        else {
          ((iStack_140._M_current)->field_2).z = (float)local_f8.field_2;
          (iStack_140._M_current)->field_0 = local_f8.field_0;
          (iStack_140._M_current)->field_1 = local_f8.field_1;
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        if (local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_188,
                     (iterator)
                     local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (vec<3,_float,_(glm::qualifier)0> *)
                     ((long)local_118.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0xc));
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
           &(local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
               ((vec<3,_float,_(glm::qualifier)0> *)
               ((long)local_118.
                      super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0xc))->field_2;
          (local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus =
               *(undefined8 *)
                ((long)local_118.
                       super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0xc);
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_188.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0xc);
        }
        if ((vec<3,_float,_(glm::qualifier)0> *)local_1a8._8_8_ == local_198) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)local_1a8,(iterator)local_1a8._8_8_,&local_1b8);
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_1a8._8_8_ + 8) =
               local_1b8.field_2;
          *(undefined8 *)local_1a8._8_8_ = local_1b8._0_8_;
          local_1a8._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)(local_1a8._8_8_ + 0xc);
        }
        local_128._0_4_ = aVar17.x;
        if (iStack_160._M_current == local_158) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,iStack_160,
                     (uint *)&local_128);
          __args = (local_118.
                    super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
          pvVar15 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems;
        }
        else {
          *iStack_160._M_current = (uint)aVar17;
          iStack_160._M_current = iStack_160._M_current + 1;
          __args = (local_118.
                    super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
          pvVar15 = (local_118.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems;
        }
        for (; this = local_e8, __args != pvVar15; __args = __args + 2) {
          if (iStack_140._M_current == local_138[0]) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_148,iStack_140,__args);
          }
          else {
            (iStack_140._M_current)->field_2 = __args->field_2;
            aVar12 = __args->field_1;
            (iStack_140._M_current)->field_0 = __args->field_0;
            (iStack_140._M_current)->field_1 = aVar12;
            iStack_140._M_current = iStack_140._M_current + 1;
          }
          if (local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_188,
                       (iterator)
                       local_188.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__args + 1);
          }
          else {
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
             &(local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length = __args[1].field_2;
            (local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus = *(undefined8 *)(__args + 1);
            local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_188.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 0xc);
          }
          if ((vec<3,_float,_(glm::qualifier)0> *)local_1a8._8_8_ == local_198) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)local_1a8,(iterator)local_1a8._8_8_,&local_1b8);
          }
          else {
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_1a8._8_8_ + 8)
                 = local_1b8.field_2;
            *(undefined8 *)local_1a8._8_8_ = local_1b8._0_8_;
            local_1a8._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)(local_1a8._8_8_ + 0xc);
          }
          aVar17.x = aVar17.x + 1;
          local_128._0_4_ = aVar17;
          if (iStack_160._M_current == local_158) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,iStack_160,
                       (uint *)&local_128);
          }
          else {
            *iStack_160._M_current = (uint)aVar17;
            iStack_160._M_current = iStack_160._M_current + 1;
          }
        }
        uVar1 = (int)aVar17 + 1;
        uVar3 = local_118.
                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2]._M_elems[0].field_0;
        uVar5 = local_118.
                super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2]._M_elems[0].field_1;
        auVar36._4_4_ = uVar5;
        auVar36._0_4_ = uVar3;
        auVar36._8_8_ = 0;
        uVar16._0_4_ = local_118.
                       super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems[0].field_0;
        uVar16._4_4_ = local_118.
                       super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems[0].field_1;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar16;
        auVar22 = vsubps_avx(auVar40,auVar36);
        auVar9._8_4_ = 0x3c23d70a;
        auVar9._0_8_ = 0x3c23d70a3c23d70a;
        auVar9._12_4_ = 0x3c23d70a;
        auVar22 = vmulps_avx512vl(auVar22,auVar9);
        auVar37._0_4_ = (float)(undefined4)uVar16 + auVar22._0_4_;
        auVar37._4_4_ = (float)uVar16._4_4_ + auVar22._4_4_;
        auVar37._8_4_ = auVar22._8_4_ + 0.0;
        auVar37._12_4_ = auVar22._12_4_ + 0.0;
        local_120 = (((vec<3,_float,_(glm::qualifier)0> *)
                     ((long)local_118.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0x18))->field_2).z +
                    ((((vec<3,_float,_(glm::qualifier)0> *)
                      ((long)local_118.
                             super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -0x18))->field_2).z -
                    (((vec<3,_float,_(glm::qualifier)0> *)
                     ((long)local_118.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0x30))->field_2).z) * 0.01
        ;
        local_128 = vmovlps_avx(auVar37);
        if (iStack_140._M_current == local_138[0]) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_148,iStack_140,(vec<3,_float,_(glm::qualifier)0> *)&local_128);
        }
        else {
          ((iStack_140._M_current)->field_2).z = local_120;
          (iStack_140._M_current)->field_0 = SUB84(local_128,0);
          (iStack_140._M_current)->field_1 = SUB84(local_128,4);
          iStack_140._M_current = iStack_140._M_current + 1;
        }
        if (local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_188,
                     (iterator)
                     local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (vec<3,_float,_(glm::qualifier)0> *)
                     ((long)local_118.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0xc));
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
           &(local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
               ((vec<3,_float,_(glm::qualifier)0> *)
               ((long)local_118.
                      super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -0xc))->field_2;
          (local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus =
               *(undefined8 *)
                ((long)local_118.
                       super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -0xc);
          local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_188.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0xc);
        }
        if ((vec<3,_float,_(glm::qualifier)0> *)local_1a8._8_8_ == local_198) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)local_1a8,(iterator)local_1a8._8_8_,&local_1b8);
        }
        else {
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_1a8._8_8_ + 8) =
               local_1b8.field_2;
          *(undefined8 *)local_1a8._8_8_ = local_1b8._0_8_;
          local_1a8._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)(local_1a8._8_8_ + 0xc);
        }
        local_fc = uVar1;
        if (iStack_160._M_current == local_158) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,iStack_160,
                     &local_fc);
        }
        else {
          *iStack_160._M_current = uVar1;
          iStack_160._M_current = iStack_160._M_current + 1;
        }
        if (iStack_160._M_current == local_158) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_168,iStack_160,
                     &local_14c);
        }
        else {
          *iStack_160._M_current = local_14c;
          iStack_160._M_current = iStack_160._M_current + 1;
        }
        aVar17.x = aVar17.x + 2;
      }
      if ((local_118.
           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_elems !=
          (vec<3,_float,_(glm::qualifier)0> *)0x0) {
        operator_delete(local_118.
                        super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar19 = uVar19 + 1;
      pvVar14 = (this->ribbons).
                super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)(((long)(this->ribbons).
                                     super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3
                              ) * -0x5555555555555555));
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"a_position","");
  (*peVar6->_vptr_ShaderProgram[0x10])(peVar6,local_98,&local_148,0,0,0xffffffff);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a_normal","");
  (*peVar6->_vptr_ShaderProgram[0x10])(peVar6,local_b8,&local_188,0,0,0xffffffff);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"a_color","");
  (*peVar6->_vptr_ShaderProgram[0x10])(peVar6,local_d8,local_1a8,0,0,0xffffffff);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  peVar6 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar6->_vptr_ShaderProgram[0x1c])(peVar6,&local_168);
  render::Engine::setMaterial
            (render::engine,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,&(this->material).value);
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if ((void *)local_1a8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148 != (vec<3,_float,_(glm::qualifier)0> **)0x0) {
    operator_delete(local_148);
  }
  return;
}

Assistant:

void RibbonArtist::createProgram() {

  // Create the program
  program = render::engine->requestShader("RIBBON", {});

  // Set the restart index for the line strip
  unsigned int restartInd = -1;
  program->setPrimitiveRestartIndex(restartInd);

  // Compute length scales and whatnot
  float normalOffset = static_cast<float>(state::lengthScale * normalOffsetFraction);

  // == Fill buffers

  // Trace a whole bunch of lines along the surface
  std::vector<glm::vec3> positions;
  std::vector<glm::vec3> normals;
  std::vector<glm::vec3> colors;
  std::vector<unsigned int> indices;
  unsigned int nPts = 0;
  const render::ValueColorMap& cmapValue = render::engine->getColorMap(cMap);
  for (size_t iLine = 0; iLine < ribbons.size(); iLine++) {

    // Process each point from the list
    std::vector<std::array<glm::vec3, 2>> line = ribbons[iLine];

    // Offset points along normals
    for (std::array<glm::vec3, 2>& x : line) {
      x[0] += x[1] * normalOffset;
    }

    // Fill the render buffer for this line
    if (line.size() <= 1) {
      continue;
    }

    // Sample a color for this line
    glm::vec3 lineColor = cmapValue.getValue(randomUnit());

    // Add a false point at the beginning (so it's not a special case for the geometry shader)
    float EPS = 0.01;
    glm::vec3 fakeFirst = line[0][0] + EPS * (line[0][0] - line[1][0]);
    positions.push_back(fakeFirst);
    normals.push_back(line.front()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Add all of the real points
    for (auto& pn : line) {
      positions.push_back(pn[0]);
      normals.push_back(pn[1]);
      colors.push_back(lineColor);
      indices.push_back(nPts++);
    }

    // Add a false point at the end too
    glm::vec3 fakeLast = line.back()[0] + EPS * (line.back()[0] - line[line.size() - 2][0]);
    positions.push_back(fakeLast);
    normals.push_back(line.back()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Restart index allows us to draw multiple lines from a single buffer
    indices.push_back(restartInd);
  }

  // Store the values in GL buffers
  program->setAttribute("a_position", positions);
  program->setAttribute("a_normal", normals);
  program->setAttribute("a_color", colors);
  program->setIndex(indices);

  render::engine->setMaterial(*program, material.get());
}